

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  FileGenerator *pFVar1;
  byte bVar2;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  bVar3;
  FileDescriptor *file;
  pointer puVar4;
  string *psVar5;
  ServiceDescriptor *pSVar6;
  DescriptorPool *this_00;
  Message *this_01;
  FieldDescriptor *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type sVar8;
  bool bVar9;
  FileOptions_OptimizeMode FVar10;
  int iVar11;
  Descriptor *pDVar12;
  Descriptor *pDVar13;
  mapped_type *ppDVar14;
  MessageLite *pMVar15;
  reference ppVar16;
  Nonnull<const_char_*> failure_msg;
  undefined1 *b;
  _Array_type *p_Var17;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *pcVar18;
  Reflection *this_03;
  long lVar19;
  _Alloc_hider _Var20;
  pointer puVar21;
  long lVar22;
  pointer pcVar23;
  MethodDescriptor *this_04;
  undefined8 uVar24;
  long lVar25;
  int i;
  int iVar26;
  string_view name;
  string_view name_00;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string_view var;
  string_view filename;
  string_view name_01;
  string_view data;
  initializer_list<const_google::protobuf::Message_*> __l_00;
  const_iterator other;
  Metadata MVar27;
  iterator iVar28;
  string_view filename_00;
  string_view filename_01;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  res;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t num_deps;
  string file_data;
  CrossFileReferences refs;
  string desc_name;
  DynamicMessageFactory factory;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  FileDescriptorProto file_proto;
  Options *in_stack_fffffffffffff698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_950;
  Options *local_948;
  anon_class_1_0_00000001 local_939;
  string local_938;
  MessageLite *local_918;
  undefined1 local_910 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  pointer local_8f0;
  string local_8e8;
  undefined1 local_8c8 [56];
  ctrl_t *local_890;
  FileGenerator *local_888;
  FileGenerator *local_880;
  undefined1 local_878 [48];
  TypeErasedState *local_848;
  AccessInfoMap *local_840;
  TypeErasedState local_838;
  TypeErasedState *local_828;
  AccessInfoMap *local_820;
  TypeErasedState local_818;
  undefined1 local_808 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  FileGenerator *local_7e8;
  undefined1 local_7e0 [16];
  _Alloc_hider _Stack_7d0;
  char *local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  _Alloc_hider _Stack_7b0;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  undefined8 local_6c8;
  undefined1 local_6c0 [24];
  btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  local_6a8;
  btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  local_690;
  string local_678;
  string local_658;
  string local_638;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  string local_5f8;
  undefined1 local_5d8 [32];
  DynamicMessageFactory local_5b8;
  TypeErasedState local_578;
  undefined1 local_568 [32];
  pointer local_548;
  pointer local_540;
  byte local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  pointer local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  undefined1 local_510;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_508;
  undefined1 local_4c0 [48];
  undefined1 local_490 [16];
  bool local_480;
  _Alloc_hider local_478;
  size_t local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  bool local_458;
  bool local_410;
  Sub local_408;
  Sub local_350;
  Sub local_298;
  Sub local_1e0;
  FileDescriptorProto local_128;
  
  local_950 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Emit(p,0,0,0x82,
                      "\n      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$\n          $file_level_enum_descriptors$ = nullptr;\n    "
                     );
  }
  else {
    local_5d8._0_8_ = local_5d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"len","");
    local_128.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         ((long)(this->enum_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->enum_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    io::Printer::Sub::Sub<unsigned_long>
              ((Sub *)&local_578.remote,(string *)local_5d8,(unsigned_long *)&local_128);
    io::Printer::Emit(p,&local_578,1,0xb7,
                      "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::EnumDescriptor* $nonnull$\n          $file_level_enum_descriptors$[$len$];\n    "
                     );
    if (local_508._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_508);
    }
    if (local_530 != &local_520) {
      operator_delete(local_530,
                      CONCAT71(local_520._M_allocated_capacity._1_7_,local_520._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_538]._M_data)
              ((anon_class_1_0_00000001 *)local_6c0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_568 + 0x10));
    local_538 = 0xff;
    if ((FileGenerator *)local_578.remote.target != (FileGenerator *)local_568) {
      operator_delete(local_578.remote.target,
                      (ulong)((long)&(((__uniq_ptr_data<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>,_true,_true>
                                        *)local_568._0_8_)->
                                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                     )._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                                     ._M_head_impl + 1));
    }
    if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
      operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
    }
  }
  file = this->file_;
  local_948 = &this->options_;
  if ((((file->service_count_ < 1) ||
       (FVar10 = GetOptimizeFor(file,local_948,(bool *)0x0), paVar7 = local_950,
       FVar10 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
      ((file->options_->field_0)._impl_.cc_generic_services_ != true)) ||
     (this->file_->service_count_ < 1)) {
    io::Printer::Emit((Printer *)local_950,0,0,0x88,
                      "\n      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$\n          $file_level_service_descriptors$ = nullptr;\n    "
                     );
  }
  else {
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"len","");
    local_128.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         CONCAT44(local_128.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                  this->file_->service_count_);
    io::Printer::Sub::Sub<int>((Sub *)&local_578.remote,&local_5f8,(int *)&local_128);
    io::Printer::Emit((Printer *)paVar7,&local_578,1,0xbd,
                      "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::ServiceDescriptor* $nonnull$\n          $file_level_service_descriptors$[$len$];\n    "
                     );
    if (local_508._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_508);
    }
    if (local_530 != &local_520) {
      operator_delete(local_530,
                      CONCAT71(local_520._M_allocated_capacity._1_7_,local_520._M_local_buf[0]) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_538]._M_data)
              ((anon_class_1_0_00000001 *)local_6c0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_568 + 0x10));
    local_538 = 0xff;
    if ((FileGenerator *)local_578.remote.target != (FileGenerator *)local_568) {
      operator_delete(local_578.remote.target,
                      (ulong)((long)&(((__uniq_ptr_data<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>,_true,_true>
                                        *)local_568._0_8_)->
                                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                     )._M_t.
                                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                     .
                                     super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                                     ._M_head_impl + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
  }
  puVar21 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 == puVar4) {
    io::Printer::Emit((Printer *)local_950,0,0,0xf7,
                      "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;\n      static constexpr ::_pb::Message* $nonnull$ const* $nullable$\n          file_default_instances = nullptr;\n    "
                     );
  }
  else {
    local_128.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
    local_128.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
    local_128.field_0._0_8_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,
               (long)puVar4 - (long)puVar21 >> 3);
    paVar7 = local_950;
    local_888 = (FileGenerator *)local_878;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"offsets","");
    local_578.remote.target = local_568;
    if (local_888 == (FileGenerator *)local_878) {
      local_568._8_8_ = local_878._8_8_;
    }
    else {
      local_578.remote.target = local_888;
    }
    local_568._1_7_ = local_878._1_7_;
    local_568[0] = local_878[0];
    local_578.remote.size = (size_t)local_880;
    local_880 = (FileGenerator *)0x0;
    local_878[0] = 0;
    local_888 = (FileGenerator *)local_878;
    local_568._16_8_ = operator_new(0x20);
    *(FileGenerator **)local_568._16_8_ = this;
    *(FileDescriptorProto **)(local_568._16_8_ + 8) = &local_128;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      ***)(local_568._16_8_ + 0x10) = &local_950;
    *(ctrl_t *)(local_568._16_8_ + 0x18) = ~kSentinel;
    local_540 = (pointer)std::
                         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                         ::_M_invoke;
    local_568._24_8_ = (MaybeInitializedPtr)0x0;
    local_548 = (pointer)std::
                         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                         ::_M_manager;
    local_538 = 1;
    local_530 = &local_520;
    local_528 = (pointer)0x0;
    local_520._M_local_buf[0] = '\0';
    local_510 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_530,0,(char *)0x0,0x522f0c);
    local_508._M_engaged = false;
    pcVar18 = local_7c0._M_local_buf + 8;
    local_7c8 = pcVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"schemas","");
    local_4c0._0_8_ = local_4c0 + 0x10;
    if (local_7c8 == pcVar18) {
      local_4c0._24_8_ = _Stack_7b0._M_p;
    }
    else {
      local_4c0._0_8_ = local_7c8;
    }
    local_4c0._8_8_ = local_7c0._M_allocated_capacity;
    local_7c0._M_allocated_capacity = 0;
    local_7c0._M_local_buf[8] = '\0';
    local_7c8 = pcVar18;
    local_4c0._32_8_ = operator_new(0x20);
    *(FileGenerator **)local_4c0._32_8_ = this;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      ***)(local_4c0._32_8_ + 8) = &local_950;
    *(FileDescriptorProto **)(local_4c0._32_8_ + 0x10) = &local_128;
    *(char *)(local_4c0._32_8_ + 0x18) = '\0';
    local_490._8_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    local_4c0._40_8_ = 0;
    local_490._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_480 = true;
    local_478._M_p = (pointer)&local_468;
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    local_458 = false;
    std::__cxx11::string::_M_replace((ulong)&local_478,0,(char *)0x0,0x522f0c);
    local_410 = false;
    io::Printer::Emit((Printer *)paVar7,&local_578,2,0x160,
                      "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
                     );
    lVar25 = 0x170;
    do {
      if (*(char *)((long)&local_5b8.prototypes_mutex_.mu_.super___atomic_base<long>._M_i + lVar25)
          == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_5d8 + lVar25 + 0x18));
      }
      if ((long *)(local_5d8 + lVar25) != *(long **)(local_5d8 + lVar25 + -0x10)) {
        operator_delete(*(long **)(local_5d8 + lVar25 + -0x10),*(long *)(local_5d8 + lVar25) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5d8[lVar25 + -0x18]]._M_data)
                ((anon_class_1_0_00000001 *)local_6c0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_618 + lVar25 + 8));
      local_5d8[lVar25 + -0x18] = 0xff;
      if ((long *)(local_618 + lVar25 + -8) != *(long **)(local_618 + lVar25 + -0x18)) {
        operator_delete(*(long **)(local_618 + lVar25 + -0x18),
                        *(long *)(local_618 + lVar25 + -8) + 1);
      }
      lVar25 = lVar25 + -0xb8;
    } while (lVar25 != 0);
    if (local_7c8 != pcVar18) {
      operator_delete(local_7c8,CONCAT71(local_7c0._9_7_,local_7c0._M_local_buf[8]) + 1);
    }
    if (local_888 != (FileGenerator *)local_878) {
      operator_delete(local_888,CONCAT71(local_878._1_7_,local_878[0]) + 1);
    }
    bVar9 = UsingImplicitWeakDescriptor(this->file_,local_948);
    if (!bVar9) {
      pFVar1 = (FileGenerator *)(local_7e0 + 8);
      local_7e8 = pFVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"defaults","");
      local_578.remote.target = local_568;
      if (local_7e8 == pFVar1) {
        local_568._8_8_ = _Stack_7d0._M_p;
      }
      else {
        local_578.remote.target = local_7e8;
      }
      local_568._1_7_ = local_7e0._9_7_;
      local_568[0] = local_7e0[8];
      local_578.remote.size = local_7e0._0_8_;
      local_7e0._0_8_ = (FileGenerator *)0x0;
      local_7e0[8] = '\0';
      local_7e8 = pFVar1;
      local_568._16_8_ = operator_new(0x18);
      *(FileGenerator **)local_568._16_8_ = this;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        ***)(local_568._16_8_ + 8) = &local_950;
      *(ctrl_t *)(local_568._16_8_ + 0x10) = ~kSentinel;
      local_540 = (pointer)std::
                           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                           ::_M_invoke;
      local_568._24_8_ = (MaybeInitializedPtr)0x0;
      local_548 = (pointer)std::
                           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                           ::_M_manager;
      local_538 = 1;
      local_530 = &local_520;
      local_528 = (pointer)0x0;
      local_520._M_local_buf[0] = '\0';
      local_510 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_530,0,(char *)0x0,0x522f0c);
      local_508._M_engaged = false;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_578;
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)local_6c0,__l,(allocator_type *)&local_5b8);
      if (local_508._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_508);
      }
      if (local_530 != &local_520) {
        operator_delete(local_530,
                        CONCAT71(local_520._M_allocated_capacity._1_7_,local_520._M_local_buf[0]) +
                        1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_538]._M_data)
                ((anon_class_1_0_00000001 *)&local_5b8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_568 + 0x10));
      local_538 = 0xff;
      if ((FileGenerator *)local_578.remote.target != (FileGenerator *)local_568) {
        operator_delete(local_578.remote.target,
                        (ulong)((long)&(((__uniq_ptr_data<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>,_true,_true>
                                          *)local_568._0_8_)->
                                       super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                       )._M_t.
                                       super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                                       .
                                       super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                                       ._M_head_impl + 1));
      }
      if (local_7e8 != pFVar1) {
        operator_delete(local_7e8,CONCAT71(local_7e0._9_7_,local_7e0[8]) + 1);
      }
      io::Printer::Emit((Printer *)local_950,local_6c0._0_8_,
                        ((long)(local_6c0._8_8_ - local_6c0._0_8_) >> 3) * -0x2c8590b21642c859,0x74,
                        "\n      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {\n          $defaults$,\n      };\n    "
                       );
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 *)local_6c0);
    }
    if (local_128.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      operator_delete(local_128.super_Message.super_MessageLite._vptr_MessageLite,
                      local_128.field_0._0_8_ -
                      (long)local_128.super_Message.super_MessageLite._vptr_MessageLite);
    }
  }
  StripSourceRetentionOptions(&local_128,this->file_,false);
  local_808._0_8_ = &local_7f8;
  local_808._8_8_ = (Message *)0x0;
  local_7f8._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_128,(string *)local_808);
  psVar5 = this->file_->name_;
  name._M_str = (char *)psVar5->_M_string_length;
  name._M_len = (size_t)"descriptor_table_protodef";
  filename_00._M_str = (char *)local_948;
  filename_00._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
  UniqueName_abi_cxx11_((string *)local_618,(cpp *)0x19,name,filename_00,in_stack_fffffffffffff698);
  paVar7 = local_950;
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"desc_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>
            ((Sub *)&local_578.remote,&local_6e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618);
  local_828 = &local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"encoded_file_proto","");
  local_4c0._0_8_ = local_4c0 + 0x10;
  if (local_828 == &local_818) {
    local_4c0._24_8_ = local_818.remote.size;
  }
  else {
    local_4c0._0_8_ = local_828;
  }
  local_4c0._8_8_ = local_820;
  local_820 = (AccessInfoMap *)0x0;
  local_818.storage[0] = '\0';
  local_828 = &local_818;
  local_4c0._32_8_ = operator_new(0x20);
  *(FileGenerator **)local_4c0._32_8_ = this;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    ***)(local_4c0._32_8_ + 8) = &local_950;
  *(string **)(local_4c0._32_8_ + 0x10) = (string *)local_808;
  *(char *)(local_4c0._32_8_ + 0x18) = '\0';
  local_490._8_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_invoke;
  local_4c0._40_8_ = 0;
  local_490._0_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_480 = true;
  local_478._M_p = (pointer)&local_468;
  local_470 = 0;
  local_468._M_local_buf[0] = '\0';
  local_458 = false;
  std::__cxx11::string::_M_replace((ulong)&local_478,0,(char *)0x0,0x522f0c);
  local_410 = false;
  io::Printer::Emit((Printer *)paVar7,&local_578,2,0x96,
                    "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
                   );
  lVar25 = 0x170;
  do {
    if (*(char *)((long)&local_5b8.prototypes_mutex_.mu_.super___atomic_base<long>._M_i + lVar25) ==
        '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_5d8 + lVar25 + 0x18));
    }
    if ((long *)(local_5d8 + lVar25) != *(long **)(local_5d8 + lVar25 + -0x10)) {
      operator_delete(*(long **)(local_5d8 + lVar25 + -0x10),*(long *)(local_5d8 + lVar25) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_5d8[lVar25 + -0x18]]._M_data)
              ((anon_class_1_0_00000001 *)local_6c0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_618 + lVar25 + 8));
    local_5d8[lVar25 + -0x18] = 0xff;
    if ((long *)(local_618 + lVar25 + -8) != *(long **)(local_618 + lVar25 + -0x18)) {
      operator_delete(*(long **)(local_618 + lVar25 + -0x18),*(long *)(local_618 + lVar25 + -8) + 1)
      ;
    }
    lVar25 = lVar25 + -0xb8;
  } while (lVar25 != 0);
  if (local_828 != &local_818) {
    operator_delete(local_828,CONCAT71(local_818._1_7_,local_818.storage[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  local_6c0._0_8_ =
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
       ::EmptyNode()::empty_node;
  local_6c0._8_8_ =
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
       ::EmptyNode()::empty_node;
  local_6c0._16_8_ = 0;
  b = absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
      ::EmptyNode()::empty_node;
  local_6a8.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
       ::EmptyNode()::empty_node;
  local_6a8.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_6a8.size_ = 0;
  local_690.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
       ::EmptyNode()::empty_node;
  local_690.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_690.size_ = 0;
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)local_6c0);
  paVar7 = local_950;
  local_890 = (ctrl_t *)(local_690.size_ + local_6a8.size_);
  if (local_890 != (ctrl_t *)0x0) {
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"len","");
    io::Printer::Sub::Sub<unsigned_long&>
              ((Sub *)&local_578.remote,&local_708,(unsigned_long *)&local_890);
    local_848 = &local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"deps","");
    local_4c0._0_8_ = local_4c0 + 0x10;
    if (local_848 == &local_838) {
      local_4c0._24_8_ = local_838.remote.size;
    }
    else {
      local_4c0._0_8_ = local_848;
    }
    local_4c0._8_8_ = local_840;
    local_840 = (AccessInfoMap *)0x0;
    local_838.storage[0] = '\0';
    local_848 = &local_838;
    local_4c0._32_8_ = operator_new(0x20);
    *(CrossFileReferences **)local_4c0._32_8_ = (CrossFileReferences *)local_6c0;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      ***)(local_4c0._32_8_ + 8) = &local_950;
    *(FileGenerator **)(local_4c0._32_8_ + 0x10) = this;
    *(char *)(local_4c0._32_8_ + 0x18) = '\0';
    local_490._8_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    local_4c0._40_8_ = 0;
    local_490._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_480 = true;
    local_478._M_p = (pointer)&local_468;
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    local_458 = false;
    std::__cxx11::string::_M_replace((ulong)&local_478,0,(char *)0x0,0x522f0c);
    local_410 = false;
    io::Printer::Emit((Printer *)paVar7,&local_578,2,0x9b,
                      "\n          static const ::_pbi::DescriptorTable* $nonnull$ const\n              $desc_table$_deps[$len$] = {\n                  $deps$,\n          };\n        "
                     );
    lVar25 = 0x170;
    do {
      if (*(char *)((long)&local_5b8.prototypes_mutex_.mu_.super___atomic_base<long>._M_i + lVar25)
          == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_5d8 + lVar25 + 0x18));
      }
      if ((long *)(local_5d8 + lVar25) != *(long **)(local_5d8 + lVar25 + -0x10)) {
        operator_delete(*(long **)(local_5d8 + lVar25 + -0x10),*(long *)(local_5d8 + lVar25) + 1);
      }
      p_Var17 = &std::__detail::__variant::
                 __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                 ::_S_vtable;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5d8[lVar25 + -0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5b8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_618 + lVar25 + 8));
      local_5d8[lVar25 + -0x18] = 0xff;
      b = (undefined1 *)p_Var17;
      if ((long *)(local_618 + lVar25 + -8) != *(long **)(local_618 + lVar25 + -0x18)) {
        operator_delete(*(long **)(local_618 + lVar25 + -0x18),
                        *(long *)(local_618 + lVar25 + -8) + 1);
        b = (undefined1 *)p_Var17;
      }
      lVar25 = lVar25 + -0xb8;
    } while (lVar25 != 0);
    if (local_848 != &local_838) {
      operator_delete(local_848,CONCAT71(local_838._1_7_,local_838.storage[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,(ulong)(local_708.field_2._0_8_ + 1));
    }
  }
  paVar7 = local_950;
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"eager","");
  local_938._M_dataplus._M_p = "false";
  io::Printer::Sub::Sub<char_const*>((Sub *)&local_578.remote,&local_638,(char **)&local_938);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"file_proto_len","");
  local_8e8._M_dataplus._M_p = (pointer)local_808._8_8_;
  if ((this->options_).strip_nonfunctional_codegen != false) {
    local_8e8._M_dataplus._M_p = (pointer)(Message *)0x0;
  }
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_4c0,&local_728,(unsigned_long *)&local_8e8);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"proto_name","");
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_408,&local_748,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"deps_ptr","");
  if (local_890 == (ctrl_t *)0x0) {
    local_910._0_8_ = &local_900;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"nullptr","");
  }
  else {
    var._M_str = "desc_table";
    var._M_len = 10;
    local_5b8._0_16_ = io::Printer::LookupVar((Printer *)local_950,var);
    local_8c8._0_8_ = &DAT_00000005;
    local_8c8._8_8_ = "_deps";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_910,(lts_20250127 *)&local_5b8,(AlphaNum *)local_8c8,(AlphaNum *)b);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_350,&local_658,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"num_deps","");
  io::Printer::Sub::Sub<unsigned_long&>(&local_298,&local_768,(unsigned_long *)&local_890);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"num_msgs","");
  local_878._16_8_ =
       (long)(this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  io::Printer::Sub::Sub<unsigned_long>(&local_1e0,&local_678,(unsigned_long *)(local_878 + 0x10));
  io::Printer::Emit((Printer *)paVar7,&local_578,6,0x226,
                    "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
                   );
  lVar25 = 0x450;
  do {
    if (*(char *)((long)&local_5b8.prototypes_mutex_.mu_.super___atomic_base<long>._M_i + lVar25) ==
        '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_5d8 + lVar25 + 0x18));
    }
    if ((long *)(local_5d8 + lVar25) != *(long **)(local_5d8 + lVar25 + -0x10)) {
      operator_delete(*(long **)(local_5d8 + lVar25 + -0x10),*(long *)(local_5d8 + lVar25) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_5d8[lVar25 + -0x18]]._M_data)
              (&local_939,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_618 + lVar25 + 8));
    local_5d8[lVar25 + -0x18] = 0xff;
    pcVar18 = extraout_RDX;
    if ((long *)(local_618 + lVar25 + -8) != *(long **)(local_618 + lVar25 + -0x18)) {
      operator_delete(*(long **)(local_618 + lVar25 + -0x18),*(long *)(local_618 + lVar25 + -8) + 1)
      ;
      pcVar18 = extraout_RDX_00;
    }
    lVar25 = lVar25 + -0xb8;
  } while (lVar25 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._0_8_ + 1);
    pcVar18 = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._0_8_ + 1);
    pcVar18 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._0_8_ != &local_900) {
    operator_delete((void *)local_910._0_8_,local_900._M_allocated_capacity + 1);
    pcVar18 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,(ulong)(local_658.field_2._M_allocated_capacity + 1))
    ;
    pcVar18 = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,(ulong)(local_748.field_2._M_allocated_capacity + 1))
    ;
    pcVar18 = extraout_RDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._0_8_ + 1);
    pcVar18 = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._0_8_ + 1);
    pcVar18 = extraout_RDX_07;
  }
  psVar5 = this->file_->name_;
  filename._M_str = pcVar18;
  filename._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
  bVar9 = protobuf::internal::cpp::IsLazilyInitializedFile((cpp *)psVar5->_M_string_length,filename)
  ;
  if (!bVar9) {
    bVar9 = UsingImplicitWeakDescriptor(this->file_,local_948);
    if (bVar9) {
      uVar24 = this->file_;
      local_910._0_8_ =
           absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_910._8_8_ =
           absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           ::EmptyNode()::empty_node;
      local_900._M_allocated_capacity = 0;
      iVar26 = ((FileDescriptor *)uVar24)->service_count_;
      if (0 < iVar26) {
        lVar25 = 0;
        local_6c8 = uVar24;
        do {
          pSVar6 = ((FileDescriptor *)uVar24)->services_;
          if (0 < pSVar6[lVar25].method_count_) {
            lVar22 = 0;
            lVar19 = 0;
            do {
              this_04 = (MethodDescriptor *)(&(pSVar6[lVar25].methods_)->super_SymbolBase + lVar22);
              pDVar12 = MethodDescriptor::input_type(this_04);
              pDVar13 = MethodDescriptor::input_type(this_04);
              local_578.remote.size = (size_t)(pDVar13->all_names_).payload_;
              local_578.remote.target = (void *)(ulong)*(ushort *)(local_578.remote.size + 2);
              local_578.remote.size = local_578.remote.size + ~(ulong)local_578.remote.target;
              ppDVar14 = absl::lts_20250127::container_internal::
                         btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                   ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_910,
                                    (key_arg<std::basic_string_view<char>_> *)&local_578.remote);
              *ppDVar14 = pDVar12;
              pDVar12 = MethodDescriptor::output_type(this_04);
              pDVar13 = MethodDescriptor::output_type(this_04);
              local_578.remote.size = (size_t)(pDVar13->all_names_).payload_;
              local_578.remote.target = (void *)(ulong)*(ushort *)(local_578.remote.size + 2);
              local_578.remote.size = local_578.remote.size + ~(ulong)local_578.remote.target;
              ppDVar14 = absl::lts_20250127::container_internal::
                         btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                   ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)local_910,
                                    (key_arg<std::basic_string_view<char>_> *)&local_578.remote);
              *ppDVar14 = pDVar12;
              lVar19 = lVar19 + 1;
              lVar22 = lVar22 + 0x50;
            } while (lVar19 < pSVar6[lVar25].method_count_);
            iVar26 = *(int *)(local_6c8 + 0x44);
            uVar24 = local_6c8;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < iVar26);
      }
      this_00 = ((FileDescriptor *)uVar24)->pool_;
      MVar27 = FileDescriptorProto::GetMetadata
                         ((FileDescriptorProto *)_FileDescriptorProto_default_instance_);
      pcVar18 = ((MVar27.descriptor)->all_names_).payload_;
      name_01._M_len = (ulong)*(ushort *)(pcVar18 + 2);
      name_01._M_str = pcVar18 + ~name_01._M_len;
      pDVar12 = DescriptorPool::FindMessageTypeByName(this_00,name_01);
      if (pDVar12 != (Descriptor *)0x0) {
        DynamicMessageFactory::DynamicMessageFactory(&local_5b8,this_00);
        pMVar15 = &DynamicMessageFactory::GetPrototype(&local_5b8,pDVar12)->super_MessageLite;
        local_918 = MessageLite::New(pMVar15,(Arena *)0x0);
        FileDescriptorProto::FileDescriptorProto
                  ((FileDescriptorProto *)&local_578.remote,(Arena *)0x0);
        FileDescriptor::CopyTo((FileDescriptor *)uVar24,(FileDescriptorProto *)&local_578.remote);
        MessageLite::SerializeAsString_abi_cxx11_
                  ((string *)local_8c8,(MessageLite *)&local_578.remote);
        data._M_str = (char *)local_8c8._0_8_;
        data._M_len = local_8c8._8_8_;
        bVar9 = MessageLite::ParseFromString(local_918,data);
        if (!bVar9) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_8e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/file.cc"
                     ,0x432,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())");
LAB_002319fe:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_8e8);
        }
        if ((MessageLite *)local_8c8._0_8_ != (MessageLite *)(local_8c8 + 0x10)) {
          operator_delete((void *)local_8c8._0_8_,local_8c8._16_8_ + 1);
        }
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&local_578.remote);
        local_8c8._0_8_ = local_918;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_8c8;
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&local_578.remote,__l_00,(allocator_type *)&local_8e8);
        if (local_578.remote.target != (void *)local_578.remote.size) {
          do {
            this_01 = (Message *)
                      (((FileGenerator *)(local_578.remote.size + -0x318))->extension_generators_).
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_578.remote.size =
                 (size_t)&(((FileGenerator *)(local_578.remote.size + -0x318))->
                          extension_generators_).
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_8c8._0_8_ = (MessageLite *)0x0;
            local_8c8._8_8_ = (MessageLite *)0x0;
            local_8c8._16_8_ = 0;
            MVar27 = Message::GetMetadata(this_01);
            this_03 = MVar27.reflection;
            Reflection::ListFields
                      (this_03,this_01,
                       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_8c8);
            uVar24 = local_8c8._8_8_;
            for (pMVar15 = (MessageLite *)local_8c8._0_8_; pMVar15 != (MessageLite *)uVar24;
                pMVar15 = (MessageLite *)&pMVar15->_internal_metadata_) {
              this_02 = (FieldDescriptor *)pMVar15->_vptr_MessageLite;
              if ((this_02->field_0x1 & 8) != 0) {
                MVar27 = Message::GetMetadata(this_01);
                local_8e8._M_string_length = (size_type)((MVar27.descriptor)->all_names_).payload_;
                local_8e8._M_dataplus._M_p =
                     (pointer)(ulong)*(ushort *)(local_8e8._M_string_length + 2);
                local_8e8._M_string_length =
                     local_8e8._M_string_length + ~(ulong)local_8e8._M_dataplus._M_p;
                ppDVar14 = absl::lts_20250127::container_internal::
                           btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                           ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                     ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                       *)local_910,
                                      (key_arg<std::basic_string_view<char>_> *)&local_8e8);
                *ppDVar14 = MVar27.descriptor;
              }
              pDVar12 = FieldDescriptor::message_type(this_02);
              if (pDVar12 != (Descriptor *)0x0) {
                bVar2 = this_02->field_0x1;
                if ((bVar2 & 8) != 0) {
                  local_8e8._M_string_length = (size_type)(pDVar12->all_names_).payload_;
                  local_8e8._M_dataplus._M_p =
                       (pointer)(ulong)*(ushort *)(local_8e8._M_string_length + 2);
                  local_8e8._M_string_length =
                       local_8e8._M_string_length + ~(ulong)local_8e8._M_dataplus._M_p;
                  ppDVar14 = absl::lts_20250127::container_internal::
                             btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                             ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                       ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                         *)local_910,
                                        (key_arg<std::basic_string_view<char>_> *)&local_8e8);
                  *ppDVar14 = pDVar12;
                  bVar2 = this_02->field_0x1;
                }
                bVar9 = (bool)((bVar2 & 0x20) >> 5);
                if (0xbf < bVar2 != bVar9) {
                  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                          (bVar9,0xbf < bVar2,
                                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED"
                                          );
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_8e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                             ,0xb54,failure_msg);
                  goto LAB_002319fe;
                }
                if ((bVar2 & 0x20) == 0) {
                  local_8e8._M_dataplus._M_p =
                       (pointer)Reflection::GetMessage
                                          (this_03,this_01,this_02,(MessageFactory *)0x0);
                  std::
                  vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  ::emplace_back<google::protobuf::Message_const*>
                            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                              *)&local_578.remote,(Message **)&local_8e8);
                }
                else {
                  for (iVar26 = 0; iVar11 = Reflection::FieldSize(this_03,this_01,this_02),
                      iVar26 < iVar11; iVar26 = iVar26 + 1) {
                    local_8e8._M_dataplus._M_p =
                         (pointer)Reflection::GetRepeatedMessage(this_03,this_01,this_02,iVar26);
                    std::
                    vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    ::emplace_back<google::protobuf::Message_const*>
                              ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                                *)&local_578.remote,(Message **)&local_8e8);
                  }
                }
              }
            }
            if ((MessageLite *)local_8c8._0_8_ != (MessageLite *)0x0) {
              operator_delete((void *)local_8c8._0_8_,local_8c8._16_8_ - local_8c8._0_8_);
            }
          } while (local_578.remote.target != (void *)local_578.remote.size);
        }
        if ((FileGenerator *)local_578.remote.target != (FileGenerator *)0x0) {
          operator_delete(local_578.remote.target,local_568._0_8_ - local_578._0_8_);
        }
        (*local_918->_vptr_MessageLite[1])();
        DynamicMessageFactory::~DynamicMessageFactory(&local_5b8);
      }
      local_938._M_dataplus._M_p = (pointer)0x0;
      local_938._M_string_length = 0;
      local_938.field_2._M_allocated_capacity = 0;
      iVar28 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *)local_910);
      uVar24 = local_910._8_8_;
      local_578.remote.target = iVar28.node_;
      local_578.remote.size._0_4_ = iVar28.position_;
      if ((local_910._8_8_ & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsi..." /* TRUNCATED STRING LITERAL */
                     );
      }
      bVar3 = *(btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)(local_910._8_8_ + 10);
      while (other.position_._0_1_ = bVar3,
            other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                           *)uVar24, other._9_7_ = 0,
            bVar9 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                    ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                              *)&local_578.remote,other), !bVar9) {
        ppVar16 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                               *)&local_578.remote);
        bVar9 = IsBootstrapProto(local_948,ppVar16->second->file_);
        if (!bVar9) {
          if (local_938._M_string_length == local_938.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
            ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                      ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                        *)&local_938,(iterator)local_938._M_string_length,&ppVar16->second);
          }
          else {
            *(Descriptor **)local_938._M_string_length = ppVar16->second;
            local_938._M_string_length = local_938._M_string_length + 8;
          }
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     *)&local_578.remote);
      }
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)local_910);
      sVar8 = local_938._M_string_length;
      if (local_938._M_dataplus._M_p != (pointer)local_938._M_string_length) {
        _Var20._M_p = local_938._M_dataplus._M_p;
        do {
          local_578.remote.size = *(undefined8 *)_Var20._M_p;
          local_568._8_8_ =
               absl::lts_20250127::internal_any_invocable::
               LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
          ;
          local_568._0_8_ = absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
          local_578.remote.target = this;
          std::
          vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
          ::emplace_back<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>
                    ((vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                      *)(this->static_initializers_ + 1),
                     (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&local_578.remote);
          (*(code *)local_568._0_8_)(1,&local_578,&local_578);
          _Var20._M_p = _Var20._M_p + 8;
        } while (_Var20._M_p != (pointer)sVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_938._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_938._M_dataplus._M_p,
                        local_938.field_2._M_allocated_capacity - (long)local_938._M_dataplus._M_p);
      }
    }
    local_568._8_8_ =
         absl::lts_20250127::internal_any_invocable::
         LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1&,google::protobuf::io::Printer*>
    ;
    local_568._0_8_ = absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
    std::
    vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
    ::emplace_back<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>
              ((vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                *)(this->static_initializers_ + 1),
               (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&local_578.remote);
    (*(code *)local_568._0_8_)(1,&local_578);
  }
  bVar9 = IsFileDescriptorProto(this->file_,local_948);
  if (bVar9) {
    local_910._0_8_ = local_950;
    local_900._M_allocated_capacity = 0;
    local_900._8_8_ = 0;
    local_8f0 = (pointer)0x0;
    bVar9 = (this->options_).opensource_runtime != false;
    local_578.remote.target = &DAT_00000006;
    if (bVar9) {
      local_578.remote.target = (FileGenerator *)0x10;
    }
    local_578.remote.size = (size_t)"proto2";
    if (bVar9) {
      local_578.remote.size = (size_t)"google::protobuf";
    }
    local_5b8.pool_ = (DescriptorPool *)"::internal";
    local_5b8.super_MessageFactory._vptr_MessageFactory = (_func_int **)0xa;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_8c8,(lts_20250127 *)&local_578.remote,(AlphaNum *)&local_5b8,
               (AlphaNum *)local_578.remote.target);
    NamespaceOpener::ChangeTo((NamespaceOpener *)local_910,local_8c8._8_8_,local_8c8._0_8_);
    if ((MessageLite *)local_8c8._0_8_ != (MessageLite *)(local_8c8 + 0x10)) {
      operator_delete((void *)local_8c8._0_8_,local_8c8._16_8_ + 1);
    }
    paVar7 = local_950;
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"dummy","");
    psVar5 = this->file_->name_;
    pcVar23 = (psVar5->_M_dataplus)._M_p;
    name_00._M_str = (char *)psVar5->_M_string_length;
    name_00._M_len = (size_t)"dynamic_init_dummy";
    filename_01._M_str = (char *)local_948;
    filename_01._M_len = (size_t)pcVar23;
    UniqueName_abi_cxx11_(&local_8e8,(cpp *)0x12,name_00,filename_01,in_stack_fffffffffffff698);
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&local_578.remote,&local_788,&local_8e8);
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"initializers","");
    puVar21 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_878._16_8_ = local_878 + 0x20;
    local_878._24_8_ = (MaybeInitializedPtr)0x0;
    local_878[0x20] = 0;
    if (puVar21 != puVar4) {
      pcVar18 = "";
      do {
        std::__cxx11::string::append((char *)(local_878 + 0x10),(ulong)pcVar18);
        DefaultInstanceName_abi_cxx11_
                  (&local_938,
                   (cpp *)((puVar21->_M_t).
                           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           .
                           super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                          ._M_head_impl)->descriptor_,(Descriptor *)local_948,(Options *)0x0,
                   SUB81(pcVar23,0));
        local_5b8.pool_ = (DescriptorPool *)local_938._M_dataplus._M_p;
        local_5b8.super_MessageFactory._vptr_MessageFactory =
             (_func_int **)local_938._M_string_length;
        local_8c8._0_8_ = &DAT_00000008;
        local_8c8._8_8_ = ".Init();";
        absl::lts_20250127::StrAppend
                  ((Nonnull<std::string_*>)(local_878 + 0x10),(AlphaNum *)&local_5b8,
                   (AlphaNum *)local_8c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
        puVar21 = puVar21 + 1;
        pcVar18 = "\n";
      } while (puVar21 != puVar4);
    }
    io::Printer::Sub::Sub<std::__cxx11::string>
              ((Sub *)local_4c0,&local_7a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_878 + 0x10));
    io::Printer::Emit((Printer *)paVar7,&local_578,2,0x1dc,
                      "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
                     );
    lVar25 = 0x170;
    do {
      if (*(char *)((long)&local_5b8.prototypes_mutex_.mu_.super___atomic_base<long>._M_i + lVar25)
          == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_5d8 + lVar25 + 0x18));
      }
      if ((long *)(local_5d8 + lVar25) != *(long **)(local_5d8 + lVar25 + -0x10)) {
        operator_delete(*(long **)(local_5d8 + lVar25 + -0x10),*(long *)(local_5d8 + lVar25) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)local_5d8[lVar25 + -0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5b8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_618 + lVar25 + 8));
      local_5d8[lVar25 + -0x18] = 0xff;
      if ((long *)(local_618 + lVar25 + -8) != *(long **)(local_618 + lVar25 + -0x18)) {
        operator_delete(*(long **)(local_618 + lVar25 + -0x18),
                        *(long *)(local_618 + lVar25 + -8) + 1);
      }
      lVar25 = lVar25 + -0xb8;
    } while (lVar25 != 0);
    if ((undefined1 *)local_878._16_8_ != local_878 + 0x20) {
      operator_delete((void *)local_878._16_8_,CONCAT71(local_878._33_7_,local_878[0x20]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
      operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,
                      (ulong)(local_788.field_2._M_allocated_capacity + 1));
    }
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_910);
  }
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree(&local_690);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree(&local_6a8);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            *)local_6c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._0_8_ != &local_608) {
    operator_delete((void *)local_618._0_8_,(ulong)(local_608._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._0_8_ != &local_7f8) {
    operator_delete((void *)local_808._0_8_,CONCAT71(local_7f8._1_7_,local_7f8._M_local_buf[0]) + 1)
    ;
  }
  FileDescriptorProto::~FileDescriptorProto(&local_128);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::EnumDescriptor* $nonnull$
          $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::ServiceDescriptor* $nonnull$
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<size_t> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset);
                 offset += offsets[i];
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    constexpr absl::string_view file_default_instances_code = R"cc(
      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {
          $defaults$,
      };
    )cc";
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      std::vector<Sub> subs = {
          {"defaults", [&] {
             for (auto& gen : message_generators_) {
               p->Emit(
                   {
                       {"ns", Namespace(gen->descriptor(), options_)},
                       {"class", ClassName(gen->descriptor())},
                   },
                   R"cc(
                     &$ns$::_$class$_default_instance_._instance,
                   )cc");
             }
           }}};
      p->Emit(subs, file_default_instances_code);
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;
      static constexpr ::_pb::Message* $nonnull$ const* $nullable$
          file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* $nonnull$ const
              $desc_table$_deps[$len$] = {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}